

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (DescriptorScriptData *__return_storage_ptr__,AddressFactory *this,string *descriptor,
          string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  Script *this_00;
  pointer *__return_storage_ptr___00;
  pointer pDVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  AddressType AVar5;
  DescriptorKeyType DVar6;
  uint8_t auVar7 [4];
  DescriptorScriptType DVar8;
  uint32_t uVar9;
  DescriptorKeyReference *key_ref_00;
  DescriptorKeyReference *key_ref_01;
  DescriptorKeyReference *key_ref_02;
  DescriptorKeyReference *key_ref_03;
  DescriptorKeyReference *key_ref_04;
  KeyData *key;
  value_type *__x;
  pointer this_01;
  uint32_t index;
  uint uVar10;
  pointer this_02;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  multisig_keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  Address local_1350;
  uint8_t local_11d0 [4];
  Script local_11c8;
  DescriptorKeyType local_1190;
  string local_1188 [344];
  DescriptorScriptReference child;
  DescriptorKeyReference key_ref;
  Descriptor desc;
  DescriptorScriptData data;
  DescriptorKeyReference *local_508 [109];
  DescriptorNode node;
  
  if (script_list !=
      (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::clear
              (script_list);
  }
  if (multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              (multisig_key_list);
  }
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->multisig_req_sig_num = 0;
  core::Descriptor::Parse(&desc,descriptor,&this->prefix_list_,this->type_);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar10 = 0; uVar4 = core::Descriptor::GetNeedArgumentNum(&desc), uVar10 < uVar4;
      uVar10 = uVar10 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,bip32_derivation_path);
  }
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll(&temp_list,&desc,&args);
    for (__x = (value_type *)
               CONCAT44(temp_list.
                        super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (DescriptorKeyType)
                        temp_list.
                        super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        __x != temp_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
               ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back(key_list,__x);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&temp_list);
  }
  core::Descriptor::GetReferenceAll(&script_refs,&desc,&args);
  core::Descriptor::GetNode(&node,&desc);
  __return_storage_ptr__->type = node.script_type_;
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->depth = 0;
  core::DescriptorScriptReference::GetLockingScript
            ((Script *)&temp_list,
             script_refs.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start);
  core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)&temp_list);
  core::Script::~Script((Script *)&temp_list);
  bVar2 = core::DescriptorScriptReference::HasAddress
                    (script_refs.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar2) {
    core::DescriptorScriptReference::GenerateAddress
              ((Address *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,this->type_);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)&temp_list);
    core::Address::~Address((Address *)&temp_list);
    AVar5 = core::DescriptorScriptReference::GetAddressType
                      (script_refs.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->address_type = AVar5;
  }
  bVar2 = core::DescriptorScriptReference::HasRedeemScript
                    (script_refs.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar2) {
    core::DescriptorScriptReference::GetRedeemScript
              ((Script *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)&temp_list);
    core::Script::~Script((Script *)&temp_list);
  }
  multisig_keys.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  multisig_keys.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  multisig_keys.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::DescriptorKeyReference::DescriptorKeyReference(&key_ref);
  switch(__return_storage_ptr__->type) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar2 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)&temp_list);
    if (bVar2) {
      core::Script::Script((Script *)&child);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript
                ((Script *)&child,(DescriptorScriptReference *)&temp_list);
    }
    this_00 = &__return_storage_ptr__->redeem_script;
    core::Script::operator=(this_00,(Script *)&child);
    core::Script::~Script((Script *)&child);
    uVar9 = 0;
    uVar4 = 0;
    while (bVar2 != false) {
      core::DescriptorScriptReference::DescriptorScriptReference(&child);
      DescriptorScriptData::DescriptorScriptData(&data);
      DVar8 = core::DescriptorScriptReference::GetScriptType
                        ((DescriptorScriptReference *)&temp_list);
      if (DVar8 - kDescriptorScriptSh < 2) {
        bVar3 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)&temp_list);
        if (bVar3) {
          core::DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)local_508,(DescriptorScriptReference *)&temp_list)
          ;
          core::DescriptorScriptReference::operator=(&child,(DescriptorScriptReference *)local_508);
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)local_508);
          DVar8 = core::DescriptorScriptReference::GetScriptType(&child);
          if ((DVar8 == kDescriptorScriptMulti) ||
             (DVar8 = core::DescriptorScriptReference::GetScriptType(&child),
             DVar8 == kDescriptorScriptSortedMulti)) {
            core::DescriptorScriptReference::GetKeyList
                      ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)local_508,&child);
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::_M_move_assign(&multisig_keys,(DescriptorScriptReference *)local_508);
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)local_508);
            uVar9 = core::DescriptorScriptReference::GetReqNum(&child);
            __return_storage_ptr__->multisig_req_sig_num = uVar9;
            bVar2 = false;
          }
          else {
            DVar8 = core::DescriptorScriptReference::GetScriptType(&child);
            if (DVar8 == kDescriptorScriptMiniscript) {
              bVar2 = false;
            }
          }
          DVar8 = core::DescriptorScriptReference::GetScriptType(&child);
          if (DVar8 == kDescriptorScriptWpkh) goto LAB_00346609;
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)local_508,(DescriptorScriptReference *)&temp_list);
          core::Script::operator=(this_00,(Script *)local_508);
        }
        else {
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)local_508,(DescriptorScriptReference *)&temp_list);
          core::Script::operator=(this_00,(Script *)local_508);
        }
        core::Script::~Script((Script *)local_508);
      }
      else {
        bVar2 = false;
      }
LAB_00346609:
      data.type = core::DescriptorScriptReference::GetScriptType
                            ((DescriptorScriptReference *)&temp_list);
      data.depth = uVar4;
      core::DescriptorScriptReference::GetLockingScript
                ((Script *)local_508,(DescriptorScriptReference *)&temp_list);
      core::Script::operator=(&data.locking_script,(Script *)local_508);
      core::Script::~Script((Script *)local_508);
      core::DescriptorScriptReference::GenerateAddress
                ((Address *)local_508,(DescriptorScriptReference *)&temp_list,this->type_);
      core::Address::operator=(&data.address,(Address *)local_508);
      core::Address::~Address((Address *)local_508);
      data.address_type =
           core::DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)&temp_list);
      bVar3 = core::DescriptorScriptReference::HasRedeemScript
                        ((DescriptorScriptReference *)&temp_list);
      if (bVar3) {
        core::DescriptorScriptReference::GetRedeemScript
                  ((Script *)local_508,(DescriptorScriptReference *)&temp_list);
        core::Script::operator=(&data.redeem_script,(Script *)local_508);
        core::Script::~Script((Script *)local_508);
      }
      bVar3 = core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)&temp_list);
      if (bVar3) {
        core::DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)local_508,(DescriptorScriptReference *)&temp_list);
        core::DescriptorKeyReference::operator=(&key_ref,local_508[0]);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)local_508);
        data.key_type = core::DescriptorKeyReference::GetKeyType(&key_ref);
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((string *)local_508,&key_ref,key_ref_02);
        std::__cxx11::string::operator=((string *)&data.key,(string *)local_508);
        std::__cxx11::string::~string((string *)local_508);
        DVar6 = core::DescriptorKeyReference::GetKeyType(&key_ref);
        __return_storage_ptr__->key_type = DVar6;
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((string *)local_508,&key_ref,key_ref_03);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_508);
        std::__cxx11::string::~string((string *)local_508);
      }
      else {
        data.key_type = kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = uVar9;
      if (script_list !=
          (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back(script_list,&data);
      }
      if ((bVar2 == false) ||
         (bVar3 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)&temp_list)
         , !bVar3)) {
        bVar2 = false;
      }
      else {
        core::DescriptorScriptReference::GetChild
                  ((DescriptorScriptReference *)local_508,(DescriptorScriptReference *)&temp_list);
        core::DescriptorScriptReference::operator=(&child,(DescriptorScriptReference *)local_508);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_508);
        core::DescriptorScriptReference::operator=((DescriptorScriptReference *)&temp_list,&child);
        uVar4 = uVar4 + 1;
      }
      DescriptorScriptData::~DescriptorScriptData(&data);
      core::DescriptorScriptReference::~DescriptorScriptReference(&child);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)&temp_list);
    break;
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptWpkh:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=
              (&key_ref,(DescriptorKeyReference *)
                        CONCAT44(temp_list.
                                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (DescriptorKeyType)
                                 temp_list.
                                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&temp_list);
    DVar6 = core::DescriptorKeyReference::GetKeyType(&key_ref);
    __return_storage_ptr__->key_type = DVar6;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((string *)&temp_list,&key_ref,key_ref_00);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)&temp_list);
    std::__cxx11::string::~string((string *)&temp_list);
    break;
  case kDescriptorScriptCombo:
    for (this_02 = script_refs.
                   super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_02 !=
        script_refs.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
      DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)&temp_list);
      temp_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           core::DescriptorScriptReference::GetScriptType(this_02);
      core::DescriptorScriptReference::GetLockingScript((Script *)&child,this_02);
      core::Script::operator=
                ((Script *)
                 &temp_list.
                  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                  _M_impl.super__Vector_impl_data._M_finish,(Script *)&child);
      core::Script::~Script((Script *)&child);
      bVar2 = core::DescriptorScriptReference::HasAddress(this_02);
      auVar7[0] = '\x01';
      auVar7[1] = '\0';
      auVar7[2] = '\0';
      auVar7[3] = '\0';
      if (bVar2) {
        core::DescriptorScriptReference::GenerateAddress((Address *)&child,this_02,this->type_);
        core::Address::operator=(&local_1350,(Address *)&child);
        core::Address::~Address((Address *)&child);
        auVar7 = (uint8_t  [4])core::DescriptorScriptReference::GetAddressType(this_02);
      }
      local_11d0 = auVar7;
      bVar2 = core::DescriptorScriptReference::HasRedeemScript(this_02);
      if (bVar2) {
        core::DescriptorScriptReference::GetRedeemScript((Script *)&child,this_02);
        core::Script::operator=(&local_11c8,(Script *)&child);
        core::Script::~Script((Script *)&child);
        local_1190 = kDescriptorKeyNull;
      }
      else {
        core::DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)&child,this_02);
        core::DescriptorKeyReference::operator=(&key_ref,(DescriptorKeyReference *)child._0_8_);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)&child);
        local_1190 = core::DescriptorKeyReference::GetKeyType(&key_ref);
        const::$_0::operator()::DescriptorKeyReference_const___const
                  ((string *)&child,&key_ref,key_ref_01);
        std::__cxx11::string::operator=(local_1188,(string *)&child);
        std::__cxx11::string::~string((string *)&child);
        if (__return_storage_ptr__->key_type == kDescriptorKeyNull) {
          __return_storage_ptr__->key_type = local_1190;
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->key);
        }
      }
      if (script_list !=
          (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back(script_list,(DescriptorScriptData *)&temp_list);
      }
      DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)&temp_list);
    }
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    _M_move_assign(&multisig_keys,
                   (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)&temp_list);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&temp_list);
    uVar4 = core::DescriptorScriptReference::GetReqNum
                      (script_refs.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->multisig_req_sig_num = uVar4;
    break;
  case kDescriptorScriptTaproot:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=
              (&key_ref,(DescriptorKeyReference *)
                        CONCAT44(temp_list.
                                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (DescriptorKeyType)
                                 temp_list.
                                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&temp_list);
    core::DescriptorScriptReference::GetTapBranch
              ((TapBranch *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TapBranch::operator=(&__return_storage_ptr__->branch,(TapBranch *)&temp_list);
    core::TapBranch::~TapBranch((TapBranch *)&temp_list);
    core::DescriptorScriptReference::GetScriptTree
              ((TaprootScriptTree *)&temp_list,
               script_refs.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TaprootScriptTree::operator=
              (&__return_storage_ptr__->tree,(TaprootScriptTree *)&temp_list);
    core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&temp_list);
    DVar6 = core::DescriptorKeyReference::GetKeyType(&key_ref);
    __return_storage_ptr__->key_type = DVar6;
    bVar2 = core::DescriptorKeyReference::HasExtPrivkey(&key_ref);
    if (bVar2) {
      core::DescriptorKeyReference::GetExtPrivkey((ExtPrivkey *)&temp_list,&key_ref);
      core::Extkey::ToString_abi_cxx11_((string *)&child,(Extkey *)&temp_list);
    }
    else {
      bVar2 = core::DescriptorKeyReference::HasExtPubkey(&key_ref);
      if (!bVar2) {
        __return_storage_ptr__->key_type = kDescriptorKeySchnorr;
        core::DescriptorKeyReference::GetSchnorrPubkey((SchnorrPubkey *)&child,&key_ref);
        core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&temp_list,(SchnorrPubkey *)&child);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)&temp_list)
        ;
        std::__cxx11::string::~string((string *)&temp_list);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&child);
        break;
      }
      core::DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&temp_list,&key_ref);
      core::Extkey::ToString_abi_cxx11_((string *)&child,(Extkey *)&temp_list);
    }
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)&child);
    std::__cxx11::string::~string((string *)&child);
    core::Extkey::~Extkey((Extkey *)&temp_list);
  }
  pDVar1 = multisig_keys.
           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (multisig_keys.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      multisig_keys.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    __return_storage_ptr___00 =
         &temp_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = multisig_keys.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != pDVar1;
        this_01 = this_01 + 1) {
      temp_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = core::DescriptorKeyReference::GetKeyType(this_01);
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((string *)__return_storage_ptr___00,this_01,key_ref_04);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                (multisig_key_list,(value_type *)&temp_list);
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    }
  }
  core::DescriptorKeyReference::~DescriptorKeyReference(&key_ref);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&multisig_keys);
  core::DescriptorNode::~DescriptorNode(&node);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&script_refs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  return __return_storage_ptr__;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_, type_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}